

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssh-certs.c
# Opt level: O0

void opensshcert_string_list_key_components
               (key_components *kc,strbuf *input,char *title,char *title2)

{
  int iVar1;
  char *name_00;
  ptrlen value_00;
  char *name;
  ptrlen value;
  size_t ti;
  uint index;
  size_t ntitles;
  char *titles [2];
  undefined1 local_58 [8];
  BinarySource src [1];
  char *title2_local;
  char *title_local;
  strbuf *input_local;
  key_components *kc_local;
  
  join_0x00000010_0x00000000_ = ptrlen_from_strbuf(input);
  BinarySource_INIT__((BinarySource *)local_58,join_0x00000010_0x00000000_);
  iVar1 = 1;
  if (title2 != (char *)0x0) {
    iVar1 = 2;
  }
  ti._4_4_ = 0;
  titles[0] = title2;
  while (*(long *)(src[0]._24_8_ + 0x10) != *(long *)(src[0]._24_8_ + 8)) {
    value.len = 0;
    while ((value.len < (ulong)(long)iVar1 &&
           (value_00 = BinarySource_get_string((BinarySource *)src[0]._24_8_),
           *(int *)(src[0]._24_8_ + 0x18) == 0))) {
      name_00 = dupprintf("%s_%u",titles[value.len - 1],(ulong)ti._4_4_);
      key_components_add_text_pl(kc,name_00,value_00);
      safefree(name_00);
      value.len = value.len + 1;
    }
    ti._4_4_ = ti._4_4_ + 1;
  }
  return;
}

Assistant:

static void opensshcert_string_list_key_components(
    key_components *kc, strbuf *input, const char *title, const char *title2)
{
    BinarySource src[1];
    BinarySource_BARE_INIT_PL(src, ptrlen_from_strbuf(input));

    const char *titles[2] = { title, title2 };
    size_t ntitles = (title2 ? 2 : 1);

    unsigned index = 0;
    while (get_avail(src)) {
        for (size_t ti = 0; ti < ntitles; ti++) {
            ptrlen value = get_string(src);
            if (get_err(src))
                break;
            char *name = dupprintf("%s_%u", titles[ti], index);
            key_components_add_text_pl(kc, name, value);
            sfree(name);
        }
        index++;
    }
}